

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void switch_tile_and_get_next_job
               (AV1_COMMON *cm,TileDataEnc *tile_data,int *cur_tile_id,int *current_mi_row,
               int *end_of_frame,int is_firstpass,BLOCK_SIZE fp_block_size)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  TileDataEnc *pTVar12;
  TileDataEnc *tile;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int local_a0;
  int local_9c;
  
  uVar10 = (cm->tiles).cols;
  uVar11 = 0;
  if (0 < (int)uVar10) {
    uVar11 = (ulong)uVar10;
  }
  uVar1 = (cm->tiles).rows;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  local_a0 = -1;
  local_9c = 0x7fffffff;
  iVar14 = 0;
  iVar16 = 0;
  pTVar12 = tile_data;
  for (uVar9 = 0; tile = pTVar12, uVar15 = uVar11, iVar13 = iVar14, uVar9 != uVar1;
      uVar9 = uVar9 + 1) {
    while (uVar15 != 0) {
      if (is_firstpass == 0) {
        iVar6 = av1_get_sb_rows_in_tile(cm,&tile->tile_info);
        iVar7 = av1_get_sb_cols_in_tile(cm,&tile->tile_info);
      }
      else {
        iVar6 = av1_get_unit_rows_in_tile(&tile->tile_info,fp_block_size);
        iVar7 = av1_get_unit_cols_in_tile(&tile->tile_info,fp_block_size);
      }
      iVar7 = iVar7 + 1 >> 1;
      if (iVar6 <= iVar7) {
        iVar7 = iVar6;
      }
      iVar6 = (tile->row_mt_sync).num_threads_working;
      iVar4 = iVar16;
      iVar5 = local_a0;
      if ((iVar6 < iVar7) &&
         (iVar7 = (tile->tile_info).mi_row_end, iVar2 = (tile->row_mt_sync).next_mi_row,
         iVar8 = iVar7 - iVar2, iVar8 != 0 && iVar2 <= iVar7)) {
        iVar7 = local_9c;
        if (iVar6 < local_9c) {
          iVar16 = 0;
          iVar7 = iVar6;
        }
        bVar3 = local_9c < iVar6;
        iVar4 = iVar8;
        iVar5 = iVar13;
        local_9c = iVar7;
        if (bVar3 || iVar8 <= iVar16) {
          iVar4 = iVar16;
          iVar5 = local_a0;
        }
      }
      local_a0 = iVar5;
      iVar16 = iVar4;
      tile = tile + 1;
      uVar15 = uVar15 - 1;
      iVar13 = iVar13 + 1;
    }
    iVar14 = iVar14 + uVar10;
    pTVar12 = pTVar12 + (int)uVar10;
  }
  if (local_a0 != -1) {
    *cur_tile_id = local_a0;
    if (is_firstpass == 0) {
      uVar10 = cm->seq_params->mib_size;
    }
    else {
      uVar10 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [fp_block_size];
    }
    get_next_job(tile_data + local_a0,current_mi_row,uVar10);
    return;
  }
  *end_of_frame = 1;
  return;
}

Assistant:

static inline void switch_tile_and_get_next_job(
    AV1_COMMON *const cm, TileDataEnc *const tile_data, int *cur_tile_id,
    int *current_mi_row, int *end_of_frame, int is_firstpass,
    const BLOCK_SIZE fp_block_size) {
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;

  int tile_id = -1;  // Stores the tile ID with minimum proc done
  int max_mis_to_encode = 0;
  int min_num_threads_working = INT_MAX;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &tile_data[tile_index];
      AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;

#if CONFIG_REALTIME_ONLY
      int num_b_rows_in_tile =
          av1_get_sb_rows_in_tile(cm, &this_tile->tile_info);
      int num_b_cols_in_tile =
          av1_get_sb_cols_in_tile(cm, &this_tile->tile_info);
#else
      int num_b_rows_in_tile =
          is_firstpass
              ? av1_get_unit_rows_in_tile(&this_tile->tile_info, fp_block_size)
              : av1_get_sb_rows_in_tile(cm, &this_tile->tile_info);
      int num_b_cols_in_tile =
          is_firstpass
              ? av1_get_unit_cols_in_tile(&this_tile->tile_info, fp_block_size)
              : av1_get_sb_cols_in_tile(cm, &this_tile->tile_info);
#endif
      int theoretical_limit_on_threads =
          AOMMIN((num_b_cols_in_tile + 1) >> 1, num_b_rows_in_tile);
      int num_threads_working = row_mt_sync->num_threads_working;

      if (num_threads_working < theoretical_limit_on_threads) {
        int num_mis_to_encode =
            this_tile->tile_info.mi_row_end - row_mt_sync->next_mi_row;

        // Tile to be processed by this thread is selected on the basis of
        // availability of jobs:
        // 1) If jobs are available, tile to be processed is chosen on the
        // basis of minimum number of threads working for that tile. If two or
        // more tiles have same number of threads working for them, then the
        // tile with maximum number of jobs available will be chosen.
        // 2) If no jobs are available, then end_of_frame is reached.
        if (num_mis_to_encode > 0) {
          if (num_threads_working < min_num_threads_working) {
            min_num_threads_working = num_threads_working;
            max_mis_to_encode = 0;
          }
          if (num_threads_working == min_num_threads_working &&
              num_mis_to_encode > max_mis_to_encode) {
            tile_id = tile_index;
            max_mis_to_encode = num_mis_to_encode;
          }
        }
      }
    }
  }
  if (tile_id == -1) {
    *end_of_frame = 1;
  } else {
    // Update the current tile id to the tile id that will be processed next,
    // which will be the least processed tile.
    *cur_tile_id = tile_id;
    const int unit_height = mi_size_high[fp_block_size];
    get_next_job(&tile_data[tile_id], current_mi_row,
                 is_firstpass ? unit_height : cm->seq_params->mib_size);
  }
}